

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
          (Generator *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  Printer *this_00;
  LogMessage *other;
  long lVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int i;
  undefined1 auVar2 [16];
  string local_d0;
  string local_b0;
  LogFinisher local_8a;
  byte local_89;
  LogMessage local_88;
  uint local_50;
  int offset;
  undefined1 local_40 [8];
  string sp;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *descriptor_local;
  Generator *this_local;
  
  sp.field_2._8_8_ = proto;
  EnumDescriptor::CopyTo(descriptor,proto);
  std::__cxx11::string::string((string *)local_40);
  MessageLite::SerializeToString((MessageLite *)sp.field_2._8_8_,(string *)local_40);
  local_50 = std::__cxx11::string::find
                       ((string *)&this->file_descriptor_serialized_,(ulong)local_40);
  local_89 = 0;
  i = extraout_EDX;
  if ((int)local_50 < 0) {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x403);
    local_89 = 1;
    other = internal::LogMessage::operator<<(&local_88,"CHECK failed: (offset) >= (0): ");
    internal::LogFinisher::operator=(&local_8a,other);
    i = extraout_EDX_00;
  }
  if ((local_89 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_88);
    i = extraout_EDX_01;
  }
  this_00 = this->printer_;
  SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)local_50,i);
  lVar1 = (long)(int)local_50;
  auVar2 = std::__cxx11::string::size();
  SimpleItoa_abi_cxx11_(&local_d0,(protobuf *)(lVar1 + auVar2._0_8_),auVar2._8_8_);
  io::Printer::Print(this_00,
                     "serialized_start=$serialized_start$,\nserialized_end=$serialized_end$,\n",
                     "serialized_start",&local_b0,"serialized_end",&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(
    const DescriptorT& descriptor, DescriptorProtoT& proto) const {
  descriptor.CopyTo(&proto);
  string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print("serialized_start=$serialized_start$,\n"
                  "serialized_end=$serialized_end$,\n",
                  "serialized_start", SimpleItoa(offset),
                  "serialized_end", SimpleItoa(offset + sp.size()));
}